

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_agent_forwarding.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  uint uVar2;
  in_addr_t iVar3;
  int iVar4;
  int iVar5;
  LIBSSH2_SESSION *pLVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  fd_set *__readfds;
  LIBSSH2_SESSION *pLVar14;
  fd_set *__writefds;
  libssh2_agent_publickey *identity;
  char *exitsignal;
  sockaddr_in sin;
  char buffer [16384];
  timeval tStack_4130;
  fd_set fStack_4120;
  ulong uStack_4098;
  long lStack_4090;
  undefined *puStack_4088;
  code *pcStack_4080;
  ulong local_4078;
  LIBSSH2_SESSION *local_4068;
  uint local_405c;
  long local_4058;
  char *local_4050;
  sockaddr local_4048;
  char local_4038 [16392];
  
  local_4050 = "none";
  if (argc < 2) {
    pcStack_4080 = (code *)0x101583;
    main_cold_16();
    return 1;
  }
  hostname = argv[1];
  username = argv[2];
  if (3 < (uint)argc) {
    commandline = argv[3];
  }
  pcStack_4080 = (code *)0x1015b2;
  uVar2 = libssh2_init(0);
  if (uVar2 != 0) {
    pcStack_4080 = (code *)0x1015fe;
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar2);
    return 1;
  }
  pcStack_4080 = (code *)0x1015c2;
  iVar3 = inet_addr(hostname);
  pcStack_4080 = (code *)0x1015d5;
  uVar2 = socket(2,1,0);
  if (uVar2 == 0xffffffff) {
    pcStack_4080 = (code *)0x1015df;
    main_cold_12();
    goto LAB_00101681;
  }
  local_4048.sa_family = 2;
  local_4048.sa_data[0] = '\0';
  local_4048.sa_data[1] = '\x16';
  pcStack_4080 = (code *)0x101624;
  local_4048.sa_data._2_4_ = iVar3;
  iVar4 = connect(uVar2,&local_4048,0x10);
  if (iVar4 == 0) {
    pcStack_4080 = (code *)0x101635;
    pLVar6 = (LIBSSH2_SESSION *)libssh2_session_init_ex(0,0,0,0);
    if (pLVar6 != (LIBSSH2_SESSION *)0x0) {
      pcStack_4080 = (code *)0x101655;
      iVar4 = libssh2_session_handshake(pLVar6,uVar2);
      if (iVar4 == 0) {
        pcStack_4080 = (code *)0x101661;
        lVar7 = libssh2_agent_init(pLVar6);
        if (lVar7 == 0) {
          pcStack_4080 = (code *)0x10166b;
          main_cold_10();
        }
        else {
          pcStack_4080 = (code *)0x1016a5;
          iVar4 = libssh2_agent_connect(lVar7);
          if (iVar4 == 0) {
            pcStack_4080 = (code *)0x1016b5;
            iVar4 = libssh2_agent_list_identities(lVar7);
            if (iVar4 == 0) {
              pcStack_4080 = (code *)0x1016d1;
              local_4068 = pLVar6;
              iVar4 = libssh2_agent_get_identity(lVar7,&local_4058,0);
              if (iVar4 != 1) {
                do {
                  if (iVar4 < 0) {
                    pcStack_4080 = (code *)0x10175a;
                    main_cold_8();
                    goto LAB_00101672;
                  }
                  pcStack_4080 = (code *)0x101700;
                  iVar5 = libssh2_agent_userauth(lVar7,username,local_4058);
                  if (iVar5 == 0) {
                    pcStack_4080 = (code *)0x10176d;
                    fprintf(_stderr,"Authentication with username %s and public key %s succeeded.\n"
                            ,username,*(undefined8 *)(local_4058 + 0x20));
                    pLVar6 = local_4068;
                    if (iVar4 == 0) {
                      pcStack_4080 = (code *)0x101784;
                      libssh2_session_set_blocking(local_4068,0);
                      local_4078 = local_4078 & 0xffffffff00000000;
                      pcVar13 = "session";
                      pcStack_4080 = (code *)0x1017ad;
                      lVar8 = libssh2_channel_open_ex(pLVar6,"session",7,0x200000,0x8000,0);
                      goto joined_r0x001017b0;
                    }
                    break;
                  }
                  pcStack_4080 = (code *)0x101725;
                  fprintf(_stderr,"Authentication with username %s and public key %s failed.\n",
                          username,*(undefined8 *)(local_4058 + 0x20));
                  pcStack_4080 = (code *)0x101735;
                  iVar4 = libssh2_agent_get_identity(lVar7,&local_4058,local_4058);
                } while (iVar4 != 1);
              }
              pcStack_4080 = (code *)0x101825;
              main_cold_9();
            }
            else {
              pcStack_4080 = (code *)0x101750;
              main_cold_4();
            }
          }
          else {
            pcStack_4080 = (code *)0x101746;
            main_cold_3();
          }
        }
      }
      else {
        pcStack_4080 = (code *)0x101672;
        main_cold_2();
      }
      goto LAB_00101672;
    }
    pcStack_4080 = (code *)0x10163f;
    main_cold_11();
  }
  else {
    pcStack_4080 = (code *)0x101646;
    main_cold_1();
  }
LAB_0010167a:
  pcStack_4080 = (code *)0x101681;
  main_cold_14();
LAB_00101681:
  pcStack_4080 = (code *)0x101686;
  main_cold_15();
  return 0;
joined_r0x001017b0:
  if (lVar8 != 0) goto LAB_00101807;
  pcVar13 = (char *)0x0;
  pcStack_4080 = (code *)0x1017c7;
  pLVar14 = pLVar6;
  iVar5 = libssh2_session_last_error(pLVar6,0,0,0);
  iVar4 = (int)pLVar14;
  lVar8 = lVar7;
  if (iVar5 != -0x25) goto LAB_001019cc;
  pcStack_4080 = (code *)0x1017da;
  waitsocket(uVar2,pLVar6);
  local_4078 = local_4078 & 0xffffffff00000000;
  pcVar13 = "session";
  pcStack_4080 = (code *)0x1017ff;
  lVar8 = libssh2_channel_open_ex(pLVar6,"session",7,0x200000,0x8000,0);
  goto joined_r0x001017b0;
LAB_00101807:
  while( true ) {
    pcStack_4080 = (code *)0x10180f;
    iVar4 = libssh2_channel_request_auth_agent(lVar8);
    if (iVar4 != -0x25) break;
    pcStack_4080 = (code *)0x10181e;
    pcVar13 = (char *)pLVar6;
    waitsocket(uVar2,pLVar6);
  }
  if (iVar4 != 0) {
    pcStack_4080 = (code *)0x1019c7;
    main_cold_7();
LAB_001019c7:
    pcStack_4080 = (code *)0x1019cc;
    main_cold_6();
LAB_001019cc:
    pcStack_4080 = waitsocket;
    main_cold_5();
    pcStack_4080 = (code *)0x102004;
    puStack_4088 = &stderr;
    lStack_4090 = lVar8;
    uStack_4098 = (ulong)uVar2;
    tStack_4130.tv_sec = 10;
    tStack_4130.tv_usec = 0;
    fStack_4120.fds_bits[0] = 0;
    fStack_4120.fds_bits[1] = 0;
    fStack_4120.fds_bits[2] = 0;
    fStack_4120.fds_bits[3] = 0;
    fStack_4120.fds_bits[4] = 0;
    fStack_4120.fds_bits[5] = 0;
    fStack_4120.fds_bits[6] = 0;
    fStack_4120.fds_bits[7] = 0;
    fStack_4120.fds_bits[8] = 0;
    fStack_4120.fds_bits[9] = 0;
    fStack_4120.fds_bits[10] = 0;
    fStack_4120.fds_bits[0xb] = 0;
    fStack_4120.fds_bits[0xc] = 0;
    fStack_4120.fds_bits[0xd] = 0;
    fStack_4120.fds_bits[0xe] = 0;
    fStack_4120.fds_bits[0xf] = 0;
    iVar5 = iVar4 + 0x3f;
    if (-1 < iVar4) {
      iVar5 = iVar4;
    }
    fStack_4120.fds_bits[iVar5 >> 6] =
         fStack_4120.fds_bits[iVar5 >> 6] | 1L << ((byte)(iVar4 % 0x40) & 0x3f);
    uVar11 = libssh2_session_block_directions(pcVar13);
    __readfds = &fStack_4120;
    if ((uVar11 & 1) == 0) {
      __readfds = (fd_set *)0x0;
    }
    __writefds = &fStack_4120;
    if ((uVar11 & 2) == 0) {
      __writefds = (fd_set *)0x0;
    }
    iVar4 = select(iVar4 + 1,__readfds,__writefds,(fd_set *)0x0,&tStack_4130);
    return iVar4;
  }
  pcStack_4080 = (code *)0x101857;
  fwrite("Agent forwarding request succeeded.\n",0x24,1,_stdout);
  while( true ) {
    pcVar1 = commandline;
    pcStack_4080 = (code *)0x10186d;
    sVar9 = strlen(commandline);
    pcVar13 = "exec";
    pcStack_4080 = (code *)0x101883;
    lVar7 = lVar8;
    iVar5 = libssh2_channel_process_startup(lVar8,"exec",4,pcVar1,sVar9 & 0xffffffff);
    iVar4 = (int)lVar7;
    if (iVar5 != -0x25) break;
    pcStack_4080 = (code *)0x101894;
    waitsocket(uVar2,local_4068);
  }
  if (iVar5 != 0) goto LAB_001019c7;
  lVar7 = 0;
  local_405c = uVar2;
  while( true ) {
    while( true ) {
      pcStack_4080 = (code *)0x1018b9;
      lVar10 = libssh2_channel_read_ex(lVar8,0,local_4038,0x4000);
      if (lVar10 < 1) break;
      pcStack_4080 = (code *)0x1018da;
      fwrite("We read:\n",9,1,_stderr);
      lVar12 = 0;
      do {
        pcStack_4080 = (code *)0x1018e9;
        fputc((int)local_4038[lVar12],_stderr);
        lVar12 = lVar12 + 1;
      } while (lVar10 != lVar12);
      lVar7 = lVar7 + lVar10;
      pcStack_4080 = (code *)0x101901;
      fputc(10,_stderr);
    }
    if (lVar10 != -0x25) break;
    pcStack_4080 = (code *)0x101917;
    waitsocket(local_405c,local_4068);
  }
  pcStack_4080 = (code *)0x10192d;
  fprintf(_stderr,"libssh2_channel_read returned %ld\n",lVar10);
  uVar2 = local_405c;
  pLVar6 = local_4068;
  while( true ) {
    pcStack_4080 = (code *)0x10193e;
    iVar4 = libssh2_channel_close(lVar8);
    if (iVar4 != -0x25) break;
    pcStack_4080 = (code *)0x10194d;
    waitsocket(uVar2,pLVar6);
  }
  pcVar13 = "none";
  if (iVar4 == 0) {
    pcStack_4080 = (code *)0x10195b;
    uVar2 = libssh2_channel_get_exit_status(lVar8);
    local_4078 = 0;
    pcStack_4080 = (code *)0x10197f;
    libssh2_channel_get_exit_signal(lVar8,&local_4050,0,0,0,0);
    pcVar13 = local_4050;
    if (local_4050 != (char *)0x0) goto LAB_0010199f;
    pcStack_4080 = (code *)0x10199d;
    fprintf(_stderr,"\nEXIT: %d bytecount: %ld\n",(ulong)uVar2,lVar7);
  }
  else {
LAB_0010199f:
    pcStack_4080 = (code *)0x1019b3;
    fprintf(_stderr,"\nGot signal: %s\n",pcVar13);
  }
  pcStack_4080 = (code *)0x1019bb;
  libssh2_channel_free(lVar8);
LAB_00101672:
  pcStack_4080 = (code *)0x10167a;
  main_cold_13();
  goto LAB_0010167a;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    struct sockaddr_in sin;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    LIBSSH2_AGENT *agent = NULL;
    struct libssh2_agent_publickey *identity, *prev_identity = NULL;
    int exitcode;
    char *exitsignal = (char *)"none";
    ssize_t bytecount = 0;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc < 2) {
        fprintf(stderr, "At least IP and username arguments are required.\n");
        return 1;
    }
    /* must be ip address only */
    hostname = argv[1];
    username = argv[2];

    if(argc > 3) {
        commandline = argv[3];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    hostaddr = inet_addr(hostname);

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    if(libssh2_session_handshake(session, sock) != 0) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* Connect to the ssh-agent */
    agent = libssh2_agent_init(session);
    if(!agent) {
        fprintf(stderr, "Failure initializing ssh-agent support\n");
        rc = 1;
        goto shutdown;
    }
    if(libssh2_agent_connect(agent)) {
        fprintf(stderr, "Failure connecting to ssh-agent\n");
        rc = 1;
        goto shutdown;
    }
    if(libssh2_agent_list_identities(agent)) {
        fprintf(stderr, "Failure requesting identities to ssh-agent\n");
        rc = 1;
        goto shutdown;
    }
    for(;;) {
        rc = libssh2_agent_get_identity(agent, &identity, prev_identity);
        if(rc == 1)
            break;
        if(rc < 0) {
            fprintf(stderr,
                    "Failure obtaining identity from ssh-agent support\n");
            rc = 1;
            goto shutdown;
        }
        if(libssh2_agent_userauth(agent, username, identity)) {
            fprintf(stderr, "Authentication with username %s and "
                    "public key %s failed.\n",
                    username, identity->comment);
        }
        else {
            fprintf(stderr, "Authentication with username %s and "
                    "public key %s succeeded.\n",
                    username, identity->comment);
            break;
        }
        prev_identity = identity;
    }
    if(rc) {
        fprintf(stderr, "Could not continue authentication\n");
        goto shutdown;
    }

#if 0
    libssh2_trace(session, ~0);
#endif

    /* Set session to non-blocking */
    libssh2_session_set_blocking(session, 0);

    /* Exec non-blocking on the remote host */
    do {
        channel = libssh2_channel_open_session(session);
        if(channel ||
           libssh2_session_last_error(session, NULL, NULL, 0) !=
           LIBSSH2_ERROR_EAGAIN)
            break;
        waitsocket(sock, session);
    } while(1);
    if(!channel) {
        fprintf(stderr, "Error\n");
        exit(1);
    }
    while((rc = libssh2_channel_request_auth_agent(channel)) ==
          LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc) {
        fprintf(stderr, "Error, could not request auth agent, "
                "error code %d.\n", rc);
        exit(1);
    }
    else {
        fprintf(stdout, "Agent forwarding request succeeded.\n");
    }
    while((rc = libssh2_channel_exec(channel, commandline)) ==
          LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc) {
        fprintf(stderr, "Error\n");
        exit(1);
    }
    for(;;) {
        ssize_t nread;
        /* loop until we block */
        do {
            char buffer[0x4000];
            nread = libssh2_channel_read(channel, buffer, sizeof(buffer) );
            if(nread > 0) {
                ssize_t i;
                bytecount += nread;
                fprintf(stderr, "We read:\n");
                for(i = 0; i < nread; ++i)
                    fputc(buffer[i], stderr);
                fprintf(stderr, "\n");
            }
            else {
                if(nread != LIBSSH2_ERROR_EAGAIN)
                    /* no need to output this for the EAGAIN case */
                    fprintf(stderr, "libssh2_channel_read returned %ld\n",
                            (long)nread);
            }
        }
        while(nread > 0);

        /* this is due to blocking that would occur otherwise so we loop on
           this condition */
        if(nread == LIBSSH2_ERROR_EAGAIN) {
            waitsocket(sock, session);
        }
        else
            break;
    }
    exitcode = 127;
    while((rc = libssh2_channel_close(channel)) == LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc == 0) {
        exitcode = libssh2_channel_get_exit_status(channel);
        libssh2_channel_get_exit_signal(channel, &exitsignal,
                                        NULL, NULL, NULL, NULL, NULL);
    }

    if(exitsignal) {
        fprintf(stderr, "\nGot signal: %s\n", exitsignal);
    }
    else {
        fprintf(stderr, "\nEXIT: %d bytecount: %ld\n",
                exitcode, (long)bytecount);
    }

    libssh2_channel_free(channel);
    channel = NULL;

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}